

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O2

_Bool ewmh_is_normal_window(natwm_state *state,xcb_window_t window)

{
  long lVar1;
  char cVar2;
  undefined4 uVar3;
  size_t i;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  _Bool _Var5;
  undefined8 uVar6;
  uint local_30 [2];
  xcb_ewmh_get_atoms_reply_t result;
  
  uVar6 = 0x107a06;
  uVar3 = xcb_ewmh_get_wm_window_type(state->ewmh,window);
  cVar2 = xcb_ewmh_get_wm_window_type_reply(state->ewmh,uVar3,local_30,0,in_R8,in_R9,uVar6);
  _Var5 = true;
  if (cVar2 == '\x01') {
    uVar4 = 0;
    do {
      _Var5 = local_30[0] == uVar4;
      if (_Var5) break;
      lVar1 = uVar4 * 4;
      uVar4 = uVar4 + 1;
    } while (*(xcb_atom_t *)(result._0_8_ + lVar1) == state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL);
    xcb_ewmh_get_atoms_reply_wipe(local_30);
  }
  return _Var5;
}

Assistant:

bool ewmh_is_normal_window(const struct natwm_state *state, xcb_window_t window)
{
        xcb_get_property_cookie_t cookie = xcb_ewmh_get_wm_window_type(state->ewmh, window);
        xcb_ewmh_get_atoms_reply_t result;
        uint8_t reply = xcb_ewmh_get_wm_window_type_reply(state->ewmh, cookie, &result, NULL);

        if (reply != 1) {
                // Treat as a normal window
                return true;
        }

        for (size_t i = 0; i < result.atoms_len; ++i) {
                xcb_atom_t type = result.atoms[i];

                // For now we only support normal windows for registering
                if (type != state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL) {
                        xcb_ewmh_get_atoms_reply_wipe(&result);

                        return false;
                }
        }

        xcb_ewmh_get_atoms_reply_wipe(&result);

        return true;
}